

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_symbols.hpp
# Opt level: O2

void __thiscall
ELFIO::symbol_section_accessor_template<ELFIO::section>::find_hash_section
          (symbol_section_accessor_template<ELFIO::section> *this)

{
  int iVar1;
  int iVar2;
  elfio *peVar3;
  pointer puVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  __uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_> _Var8;
  ulong uVar9;
  
  peVar3 = (this->elf_file->sections).parent;
  iVar1 = *(int *)&(peVar3->sections_).
                   super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(peVar3->sections_).
                   super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = 0;
  while( true ) {
    if (((uint)(iVar1 - iVar2) >> 3 & 0xffff) == uVar9) {
      return;
    }
    peVar3 = (this->elf_file->sections).parent;
    puVar4 = (peVar3->sections_).
             super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)((long)(peVar3->sections_).
                              super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3)) {
      _Var8._M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
      super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl =
           *(tuple<ELFIO::section_*,_std::default_delete<ELFIO::section>_> *)&puVar4[uVar9]._M_t;
    }
    else {
      _Var8._M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
      super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl =
           (tuple<ELFIO::section_*,_std::default_delete<ELFIO::section>_>)
           (_Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>)0x0;
    }
    uVar5 = (**(code **)(*(long *)_Var8._M_t.
                                  super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                  .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl +
                        0x58))(_Var8._M_t.
                               super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                               .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl);
    uVar6 = (*this->symbol_section->_vptr_section[2])();
    if ((uVar5 == (uVar6 & 0xffff)) &&
       (((iVar7 = (**(code **)(*(long *)_Var8._M_t.
                                        super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                        .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl
                              + 0x28))
                            (_Var8._M_t.
                             super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                             .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl),
         iVar7 == 5 ||
         (iVar7 = (**(code **)(*(long *)_Var8._M_t.
                                        super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                        .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl
                              + 0x28))
                            (_Var8._M_t.
                             super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                             .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl),
         iVar7 == 0x6ffffff6)) ||
        (iVar7 = (**(code **)(*(long *)_Var8._M_t.
                                       super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                       .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl
                             + 0x28))
                           (_Var8._M_t.
                            super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                            .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl),
        iVar7 == 0x6ffffef5)))) break;
    uVar9 = uVar9 + 1;
  }
  this->hash_section =
       (section *)
       _Var8._M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
       super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl;
  this->hash_section_index = (Elf_Half)uVar9;
  return;
}

Assistant:

void find_hash_section()
    {
        Elf_Half nSecNo = elf_file.sections.size();
        for ( Elf_Half i = 0; i < nSecNo; ++i ) {
            const section* sec = elf_file.sections[i];
            if ( sec->get_link() == symbol_section->get_index() &&
                 ( sec->get_type() == SHT_HASH ||
                   sec->get_type() == SHT_GNU_HASH ||
                   sec->get_type() == DT_GNU_HASH ) ) {
                hash_section       = sec;
                hash_section_index = i;
                break;
            }
        }
    }